

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::ModelProto::InternalSwap(ModelProto *this,ModelProto *other)

{
  undefined4 uVar1;
  string *this_00;
  long in_RSI;
  RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *in_RDI;
  string *in_stack_ffffffffffffff68;
  ExtensionSet *in_stack_ffffffffffffffa8;
  ExtensionSet *in_stack_ffffffffffffffb0;
  
  google::protobuf::internal::ExtensionSet::Swap
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (string *)(in_RSI + 8);
  uVar1 = (in_RDI->super_RepeatedPtrFieldBase).current_size_;
  if ((uVar1 & 1) != 1) {
    if (((uint)*(void **)this_00 & 1) != 1) goto LAB_00463425;
  }
  if (((uint)*(void **)this_00 & 1) == 1) {
    google::protobuf::internal::InternalMetadata::
    PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
              ((InternalMetadata *)this_00);
    in_stack_ffffffffffffff68 = this_00;
  }
  else {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              ((InternalMetadata *)this_00);
    in_stack_ffffffffffffff68 = this_00;
  }
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
            ((InternalMetadata *)in_RDI,in_stack_ffffffffffffff68);
LAB_00463425:
  std::swap<unsigned_int>
            ((uint *)&in_RDI[1].super_RepeatedPtrFieldBase.rep_,(uint *)(in_RSI + 0x28));
  google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::InternalSwap
            (in_RDI,(RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)
                    in_stack_ffffffffffffff68);
  google::protobuf::internal::memswap<32>((char *)in_RDI,(char *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

void ModelProto::InternalSwap(ModelProto* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  pieces_.InternalSwap(&other->pieces_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ModelProto, denormalizer_spec_)
      + sizeof(ModelProto::denormalizer_spec_)
      - PROTOBUF_FIELD_OFFSET(ModelProto, trainer_spec_)>(
          reinterpret_cast<char*>(&trainer_spec_),
          reinterpret_cast<char*>(&other->trainer_spec_));
}